

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void interactiveMode(void)

{
  initializer_list<chatra::Script> __l;
  bool blockContinuation_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  undefined8 uVar8;
  undefined8 uVar9;
  size_t sVar10;
  element_type *this;
  Script *local_450;
  NativeException *ex;
  string local_350;
  string local_330;
  Script *local_310;
  Script local_308;
  Script *local_2c8;
  size_type local_2c0;
  vector<chatra::Script,_std::allocator<chatra::Script>_> local_2b8;
  allocator local_299;
  string local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> scriptName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> firstToken;
  size_t t0Length;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  char *local_1c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  char *local_1b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  string local_170;
  char *local_150;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  char *local_140;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined8 local_e0;
  undefined8 local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  uint local_b0;
  allocator local_a9;
  uint i_1;
  string subLine;
  size_t i;
  uint lineIndent;
  size_t length;
  char *buffer;
  string local_50 [6];
  bool blockContinuation;
  bool lineContinuation;
  string line;
  string lines;
  uint lineNo;
  uint sectionNo;
  
  signal(2,signalHandler);
  rl_bind_key(9,rl_insert);
  stifle_history(1000);
  peVar4 = std::__shared_ptr_access<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&runtime);
  iVar3 = (*peVar4->_vptr_Runtime[10])();
  interactiveInstanceId = CONCAT44(extraout_var,iVar3);
  dLog(0,"Chatra interactive frontend");
  dLog(0,"type \"!h\" to show debugger command help");
  lines.field_2._12_4_ = 0;
  lines.field_2._8_4_ = 1;
  std::__cxx11::string::string((string *)(line.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_50);
  bVar1 = false;
  blockContinuation_00 = false;
  do {
    pcVar5 = prompt(blockContinuation_00,bVar1,lines.field_2._12_4_,lines.field_2._8_4_);
    pcVar5 = (char *)readline(pcVar5);
    sVar6 = strlen(pcVar5);
    lines.field_2._8_4_ = lines.field_2._8_4_ + 1;
    i._4_4_ = 0;
    for (subLine.field_2._8_8_ = 0; (ulong)subLine.field_2._8_8_ < sVar6;
        subLine.field_2._8_8_ = subLine.field_2._8_8_ + 1) {
      if (pcVar5[subLine.field_2._8_8_] == '\t') {
        i._4_4_ = i._4_4_ + 1;
      }
      else if ((((subLine.field_2._8_8_ + 3 < sVar6) && (pcVar5[subLine.field_2._8_8_] == ' ')) &&
               (pcVar5[subLine.field_2._8_8_ + 1] == ' ')) &&
              ((pcVar5[subLine.field_2._8_8_ + 2] == ' ' &&
               (pcVar5[subLine.field_2._8_8_ + 3] == ' ')))) {
        i._4_4_ = i._4_4_ + 1;
        subLine.field_2._8_8_ = subLine.field_2._8_8_ + 3;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i_1,pcVar5,sVar6,&local_a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    if (bVar1 != false) {
      for (local_b0 = 0; local_b0 < i._4_4_ + 2U; local_b0 = local_b0 + 1) {
        local_b8 = std::__cxx11::string::cbegin();
        local_c0 = std::__cxx11::string::insert(&i_1,local_b8,9);
      }
    }
    local_c8._M_current = (char *)std::__cxx11::string::cend();
    local_d8 = std::__cxx11::string::cbegin();
    local_e0 = std::__cxx11::string::cend();
    local_d0 = std::
               find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,interactiveMode()::__0>
                         (local_d8,local_e0);
    bVar1 = __gnu_cxx::operator!=(&local_c8,&local_d0);
    if (bVar1) {
      uVar8 = std::__cxx11::string::data();
      add_history(uVar8);
    }
    uVar7 = std::__cxx11::string::empty();
    if (((uVar7 & 1) != 0) || (pcVar5 = (char *)std::__cxx11::string::back(), *pcVar5 != '\n')) {
      std::__cxx11::string::operator+=((string *)&i_1,'\n');
    }
    uVar7 = std::__cxx11::string::size();
    if (uVar7 < 2) {
LAB_001140d3:
      bVar1 = false;
      std::__cxx11::string::operator+=(local_50,(string *)&i_1);
      while (it._M_current = (char *)std::__cxx11::string::find((char *)local_50,0x30f5b1),
            it._M_current != (char *)0xffffffffffffffff) {
        std::__cxx11::string::erase((ulong)local_50,(ulong)it._M_current);
      }
      std::__cxx11::string::operator+=((string *)(line.field_2._M_local_buf + 8),local_50);
      if (blockContinuation_00 == false) {
        local_148._M_current = (char *)std::__cxx11::string::cbegin();
        local_150 = (char *)std::__cxx11::string::cend();
        __beg = std::
                find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char)>
                          (local_148,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_150,chatra::isNotSpace);
        local_140 = __beg._M_current;
        __end._M_current = (char *)std::__cxx11::string::cend();
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)&local_170,__beg,__end,
                   (allocator<char> *)(input.field_2._M_local_buf + 0xf));
        bVar2 = isBlockStatement(&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator((allocator<char> *)(input.field_2._M_local_buf + 0xf));
        if (!bVar2) goto LAB_001142b0;
        blockContinuation_00 = true;
        std::__cxx11::string::clear();
      }
      else {
        uVar7 = std::__cxx11::string::size();
        if (uVar7 < 2) {
          blockContinuation_00 = false;
LAB_001142b0:
          std::__cxx11::string::clear();
          local_1b0._M_current = (char *)std::__cxx11::string::cbegin();
          local_1c0._M_current = (char *)std::__cxx11::string::cbegin();
          local_1c8 = (char *)std::__cxx11::string::cend();
          local_1b8 = (char *)std::
                              find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char)>
                                        (local_1c0,
                                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          )local_1c8,chatra::isNotSpace);
          std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (local_1b0,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_1b8);
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)((long)&line.field_2 + 8));
          std::__cxx11::string::clear();
          lines.field_2._8_4_ = 1;
          local_1d0._M_current = (char *)std::__cxx11::string::cend();
          uVar8 = std::__cxx11::string::cbegin();
          uVar9 = std::__cxx11::string::cend();
          local_1d8 = std::
                      find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,interactiveMode()::__1>
                                (uVar8,uVar9);
          bVar2 = __gnu_cxx::operator==(&local_1d0,&local_1d8);
          if (!bVar2) {
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_1a8);
            if (*pcVar5 == '!') {
              processDebuggerCommand((string *)local_1a8);
            }
            else {
              sVar10 = findToken((string *)local_1a8,0);
              if (sVar10 != 0) {
                std::__cxx11::string::substr
                          ((ulong)((long)&scriptName.field_2 + 8),(ulong)local_1a8);
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&scriptName.field_2 + 8),"catch");
                if ((bVar2) ||
                   (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&scriptName.field_2 + 8),"finally"), bVar2)) {
                  uVar8 = std::__cxx11::string::data();
                  dError("warning: %s block on top-level was ignored since it has no effect in interactive mode."
                         ,uVar8);
                  pos._4_4_ = 3;
                }
                else {
                  pos._4_4_ = 0;
                }
                std::__cxx11::string::~string((string *)(scriptName.field_2._M_local_buf + 8));
                if (pos._4_4_ != 0) goto LAB_001149fc;
              }
              std::__cxx11::to_string(&local_278,lines.field_2._12_4_);
              std::operator+(&local_258,"chatra[",&local_278);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_238,&local_258,"]");
              std::__cxx11::string::~string((string *)&local_258);
              std::__cxx11::string::~string((string *)&local_278);
              this = std::__shared_ptr_access<Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Host,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&host);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_298,"",&local_299);
              ex._7_1_ = 1;
              local_310 = &local_308;
              std::__cxx11::string::string((string *)&local_330,(string *)local_238);
              std::__cxx11::string::string((string *)&local_350,(string *)local_1a8);
              chatra::Script::Script(&local_308,&local_330,&local_350);
              ex._7_1_ = 0;
              local_2c0 = 1;
              local_2c8 = &local_308;
              std::allocator<chatra::Script>::allocator
                        ((allocator<chatra::Script> *)((long)&ex + 6));
              __l._M_len = local_2c0;
              __l._M_array = local_2c8;
              std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
                        (&local_2b8,__l,(allocator<chatra::Script> *)((long)&ex + 6));
              Host::push(this,&local_298,&local_2b8);
              std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector(&local_2b8);
              std::allocator<chatra::Script>::~allocator
                        ((allocator<chatra::Script> *)((long)&ex + 6));
              local_450 = (Script *)&local_2c8;
              do {
                local_450 = local_450 + -1;
                chatra::Script::~Script(local_450);
              } while (local_450 != &local_308);
              std::__cxx11::string::~string((string *)&local_350);
              std::__cxx11::string::~string((string *)&local_330);
              std::__cxx11::string::~string((string *)&local_298);
              std::allocator<char>::~allocator((allocator<char> *)&local_299);
              peVar4 = std::
                       __shared_ptr_access<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<chatra::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&runtime);
              (*peVar4->_vptr_Runtime[0xc])(peVar4,interactiveInstanceId,local_238,local_1a8);
              std::__cxx11::string::~string((string *)local_238);
              interruptible<interactiveMode()::__2>();
              lines.field_2._12_4_ = lines.field_2._12_4_ + 1;
            }
          }
LAB_001149fc:
          std::__cxx11::string::~string((string *)local_1a8);
        }
        else {
          std::__cxx11::string::clear();
        }
      }
    }
    else {
      std::__cxx11::string::size();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&i_1);
      if (*pcVar5 != '\\') goto LAB_001140d3;
      bVar1 = true;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)&local_128,(ulong)&i_1);
      std::operator+(&local_108,&local_128,'\n');
      std::__cxx11::string::operator+=(local_50,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
    }
    std::__cxx11::string::~string((string *)&i_1);
  } while( true );
}

Assistant:

[[noreturn]] static void interactiveMode() {
	std::signal(SIGINT, signalHandler);

	rl_bind_key('\t', rl_insert);
	stifle_history(1000);

	interactiveInstanceId = runtime->createInteractiveInstance();

	dLog(0, "Chatra interactive frontend");
	dLog(0, "type \"!h\" to show debugger command help");

	unsigned sectionNo = 0;
	unsigned lineNo = 1;
	std::string lines;
	std::string line;
	bool lineContinuation = false;
	bool blockContinuation = false;

	for (;;) {
		auto buffer = readline(prompt(blockContinuation, lineContinuation, sectionNo, lineNo));
		auto length = std::strlen(buffer);
		lineNo++;

		unsigned lineIndent = 0;
		for (size_t i = 0; i < length; i++) {
			if (buffer[i] == '\t')
				lineIndent++;
			else if (i + 3 < length && buffer[i] == ' ' && buffer[i + 1] == ' ' && buffer[i + 2] == ' ' && buffer[i + 3] == ' ') {
				lineIndent++;
				i += 3;
			}
		}

		auto subLine = std::string(buffer, length);

		if (lineContinuation) {
			for (unsigned i = 0; i < lineIndent + 2; i++)
				subLine.insert(subLine.cbegin(), '\t');
		}

		if (subLine.cend() != std::find_if(subLine.cbegin(), subLine.cend(), [](char c) {
				return cha::isNotSpace(c) && c != '\n';  })) {
			add_history(const_cast<char*>(subLine.data()));
		}

		if (subLine.empty() || subLine.back() != '\n')  // may be always true
			subLine += '\n';

		if (subLine.size() >= 2 && subLine[subLine.size() - 2] == '\\') {
			lineContinuation = true;
			line += subLine.substr(0, subLine.size() - 2) + '\n';
			continue;
		}
		else {
			lineContinuation = false;
			line += subLine;
		}

		// Remove line continuation marker when it comes from history and
		// contains wrapped line
		for (;;) {
			auto pos = line.find("\\\n");
			if (pos == std::string::npos)
				break;
			line.erase(pos, 1);
		}

		lines += line;
		if (blockContinuation) {
			if (line.size() <= 1)
				blockContinuation = false;
			else {
				line.clear();
				continue;
			}
		}
		else {
			auto it = std::find_if(line.cbegin(), line.cend(), cha::isNotSpace);
			if (isBlockStatement(std::string(it, line.cend()))) {
				blockContinuation = true;
				line.clear();
				continue;
			}
		}
		line.clear();
		auto input = lines.substr(std::distance(lines.cbegin(), std::find_if(lines.cbegin(), lines.cend(), cha::isNotSpace)));
		lines.clear();
		lineNo = 1;

		if (input.cend() == std::find_if(input.cbegin(), input.cend(), [](char c) {
				return cha::isNotSpace(c) && c != '\n';  })) {
			continue;
		}

		if (input[0] == '!') {
			processDebuggerCommand(input);
			continue;
		}

		auto t0Length = findToken(input);
		if (t0Length != 0) {
			auto firstToken = input.substr(0, t0Length);
			if (firstToken == "catch" || firstToken == "finally") {
				dError("warning: %s block on top-level was ignored since it has no effect in interactive mode.",
						firstToken.data());
				continue;
			}
		}

		try {
			auto scriptName = "chatra[" + std::to_string(sectionNo++) + "]";
			host->push("", {{scriptName, input}});
			runtime->push(interactiveInstanceId, scriptName, input);
		}
		catch (const cha::NativeException& ex) {
			dError("interactive mode: %s", ex.what() == nullptr ? "error" : ex.what());
			continue;
		}

		interruptible([&]() {
			runUntilBreak();
		});
	}
}